

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineChart.cpp
# Opt level: O0

void __thiscall chart::createWindow(chart *this,uint x,uint y,string *des)

{
  VideoMode mode;
  uint in_EDX;
  uint in_ESI;
  String *in_RDI;
  ContextSettings settings;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffeb4;
  ContextSettings *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  Uint32 style;
  Rect<float> *this_00;
  String *in_stack_fffffffffffffed8;
  View *this_01;
  Window *in_stack_fffffffffffffee0;
  Text *this_02;
  String *__s;
  locale *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  undefined4 uVar3;
  uint uVar4;
  string *filename;
  Font *in_stack_ffffffffffffff18;
  undefined1 local_b9 [33];
  Rect<float> local_98;
  VideoMode local_88 [2];
  string local_68;
  VideoMode local_40;
  ContextSettings local_34;
  uint local_10;
  uint local_c;
  
  style = (Uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  uVar3 = SUB84(in_RDI,0);
  uVar4 = (uint)((ulong)in_RDI >> 0x20);
  uVar2 = 0;
  uVar1 = 0;
  local_10 = in_EDX;
  local_c = in_ESI;
  sf::ContextSettings::ContextSettings(&local_34,0,0,0,1,1,0,false);
  local_34.antialiasingLevel = 3;
  sf::VideoMode::VideoMode(&local_40,local_c,local_10,0x20);
  filename = &local_68;
  std::locale::locale((locale *)filename);
  sf::String::String(in_RDI,(string *)CONCAT44(uVar4,uVar3),in_stack_fffffffffffffef0);
  local_88[0].bitsPerPixel = local_40.bitsPerPixel;
  local_88[0].width = local_40.width;
  local_88[0].height = local_40.height;
  mode._4_8_ = in_RDI;
  mode.width = uVar4;
  sf::Window::create(in_stack_fffffffffffffee0,mode,in_stack_fffffffffffffed8,style,
                     in_stack_fffffffffffffec8);
  sf::String::~String((String *)0x12990a);
  std::locale::~locale((locale *)&local_68);
  this_01 = (View *)((long)&in_RDI[0x10].m_string.field_2 + 8);
  this_00 = &local_98;
  sf::Rect<float>::Rect(this_00,-20.0,0.0,(float)local_c,(float)local_10);
  sf::View::reset(this_01,this_00);
  this_02 = (Text *)&in_RDI[1].m_string.field_2;
  sf::RenderTarget::setView
            ((RenderTarget *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),
             (View *)CONCAT44(in_stack_fffffffffffffeac,uVar1));
  sf::RenderTarget::clear
            ((RenderTarget *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),
             (Color *)CONCAT44(in_stack_fffffffffffffeac,uVar1));
  sf::Window::display((Window *)this_02);
  __s = in_RDI + 0x17;
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)__s,(allocator<char> *)this_02)
  ;
  sf::Font::loadFromFile(in_stack_ffffffffffffff18,filename);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  sf::Text::setFont((Text *)&in_RDI[0x1b].m_string.field_2,(Font *)(in_RDI + 0x17));
  std::locale::locale((locale *)&stack0xffffffffffffff18);
  sf::String::String(in_RDI,(char *)CONCAT44(uVar4,uVar3),(locale *)this_03);
  sf::Text::setString((Text *)CONCAT44(in_stack_fffffffffffffeb4,uVar2),
                      (String *)CONCAT44(in_stack_fffffffffffffeac,uVar1));
  sf::String::~String((String *)0x129a6b);
  std::locale::~locale((locale *)&stack0xffffffffffffff18);
  sf::Text::setCharacterSize((Text *)&in_RDI[0x1b].m_string.field_2,0xe);
  sf::Text::setFillColor(this_02,(Color *)this_01);
  return;
}

Assistant:

void chart::createWindow(unsigned x, unsigned y, std::string des)
{
    sf::ContextSettings settings;
    settings.antialiasingLevel = 3;

    window.create(sf::VideoMode(x, y), des, sf::Style::Default || sf::Style::Close, settings);
    view.reset(sf::FloatRect(-20, 0, x, y));
    window.setView(view);

    window.clear(sf::Color::Black);
    window.display();

    font.loadFromFile("Roboto-Regular.ttf");
    text.setFont(font);
    text.setString("0");
    text.setCharacterSize(14);
    text.setFillColor(sf::Color::White);
}